

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O1

unsigned_long mbedtls_timing_get_timer(mbedtls_timing_hr_time *val,int reset)

{
  unsigned_long uVar1;
  timeval offset;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  if (reset == 0) {
    uVar1 = (local_28.tv_usec - *(long *)(val->opaque + 8)) / 1000 +
            (local_28.tv_sec - *(long *)val->opaque) * 1000;
  }
  else {
    *(__time_t *)val->opaque = local_28.tv_sec;
    *(__suseconds_t *)(val->opaque + 8) = local_28.tv_usec;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

unsigned long mbedtls_timing_get_timer( struct mbedtls_timing_hr_time *val, int reset )
{
    unsigned long delta;
    struct timeval offset;
    struct _hr_time *t = (struct _hr_time *) val;

    gettimeofday( &offset, NULL );

    if( reset )
    {
        t->start.tv_sec  = offset.tv_sec;
        t->start.tv_usec = offset.tv_usec;
        return( 0 );
    }

    delta = ( offset.tv_sec  - t->start.tv_sec  ) * 1000
          + ( offset.tv_usec - t->start.tv_usec ) / 1000;

    return( delta );
}